

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

Mini_Lut_t * Gia_ManToMiniLut(Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  size_t __n;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  word wVar5;
  bool bVar6;
  int w;
  int iVar7;
  uint uVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  void *__s;
  Mini_Lut_t *p;
  uint *puVar12;
  Vec_Int_t *pVVar13;
  Vec_Bit_t *__ptr;
  word *pwVar14;
  word *pwVar15;
  byte bVar16;
  ulong uVar17;
  Vec_Wrd_t *pVVar18;
  long lVar19;
  ulong uVar20;
  word *pwVar21;
  uint uVar22;
  int iVar23;
  word *pLimit;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  int Fanin;
  int pVars [16];
  uint local_d4;
  uint local_a4;
  long local_a0;
  long local_98;
  Gia_Obj_t *local_90;
  int *local_88;
  int *local_80;
  uint local_78 [18];
  
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 0x10;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  pVVar10->pArray = piVar11;
  iVar9 = pGia->nObjs;
  lVar25 = (long)iVar9;
  iVar7 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar7 = iVar9;
  }
  if ((iVar7 == 0) || (__s = malloc((long)iVar7 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,lVar25 * 4);
  }
  local_a0 = lVar25;
  if (pGia->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x137,"Mini_Lut_t *Gia_ManToMiniLut(Gia_Man_t *)");
  }
  iVar7 = Gia_ManLutSizeMax(pGia);
  iVar9 = 2;
  if (2 < iVar7) {
    iVar9 = iVar7;
  }
  local_d4 = 1 << ((char)iVar9 - 6U & 0x1f);
  if (iVar7 < 7) {
    local_d4 = 1;
  }
  if (0x10 < iVar7) {
    __assert_fail("LutSize >= 2 && LutSize <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/minilut.h"
                  ,0x96,"Mini_Lut_t *Mini_LutStart(int)");
  }
  p = (Mini_Lut_t *)calloc(1,0x20);
  p->LutSize = iVar9;
  p->nCap = 0xff;
  piVar11 = (int *)malloc((ulong)(uint)(iVar9 * 0xff) << 2);
  p->pArray = piVar11;
  uVar8 = 0xff << ((char)iVar9 - 5U & 0x1f);
  if (iVar7 < 6) {
    uVar8 = 0xff;
  }
  puVar12 = (uint *)malloc((ulong)uVar8 << 2);
  p->pTruths = puVar12;
  Mini_LutPush(p,0,(int *)0x0,(uint *)0x0);
  Mini_LutPush(p,0,(int *)0x0,(uint *)0x0);
  uVar8 = 1 << ((char)p->LutSize - 5U & 0x1f);
  if (p->LutSize < 6) {
    uVar8 = 1;
  }
  if (0 < (int)uVar8) {
    puVar12 = p->pTruths;
    __n = (ulong)uVar8 * 4;
    memset(puVar12,0,__n);
    memset(puVar12 + uVar8,0xff,__n);
  }
  Gia_ManFillValue(pGia);
  pGia->pObjs->Value = 0;
  pVVar13 = pGia->vCis;
  if (0 < pVVar13->nSize) {
    lVar25 = 0;
    do {
      iVar7 = pVVar13->pArray[lVar25];
      if (((long)iVar7 < 0) || (pGia->nObjs <= iVar7)) goto LAB_00781149;
      pGVar4 = pGia->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      Mini_LutPush(p,0,(int *)0x0,(uint *)0x0);
      pGVar4[iVar7].Value = p->nSize - 1;
      lVar25 = lVar25 + 1;
      pVVar13 = pGia->vCis;
    } while (lVar25 < pVVar13->nSize);
  }
  __ptr = Gia_ManFindComplLuts(pGia);
  Gia_ObjComputeTruthTableStart(pGia,iVar9);
  iVar9 = pGia->nObjs;
  if (1 < iVar9) {
    local_98 = (long)(int)local_d4;
    uVar24 = 1;
    do {
      pVVar13 = pGia->vMapping;
      if ((long)pVVar13->nSize <= (long)uVar24) goto LAB_0078112a;
      if (pVVar13->pArray[uVar24] != 0) {
        pVVar10->nSize = 0;
        lVar25 = (long)pVVar13->nSize;
        if (lVar25 <= (long)uVar24) goto LAB_0078112a;
        lVar26 = 0;
        while( true ) {
          piVar11 = pVVar13->pArray;
          lVar19 = (long)piVar11[uVar24];
          if ((lVar19 < 0) || ((uint)lVar25 <= (uint)piVar11[uVar24])) goto LAB_0078112a;
          if (piVar11[lVar19] <= lVar26) break;
          Vec_IntPush(pVVar10,piVar11[lVar19 + lVar26 + 1]);
          lVar26 = lVar26 + 1;
          pVVar13 = pGia->vMapping;
          lVar25 = (long)pVVar13->nSize;
          if (lVar25 <= (long)uVar24) goto LAB_0078112a;
        }
        uVar8 = pVVar10->nSize;
        if (6 < (int)uVar8) {
          uVar17 = (ulong)(uVar8 - 7);
          uVar27 = uVar17;
          do {
            if ((long)pVVar10->nSize <= (long)uVar27) goto LAB_0078112a;
            Vec_IntPush(pVVar10,pVVar10->pArray[uVar27]);
            bVar6 = 0 < (long)uVar27;
            uVar27 = uVar27 - 1;
          } while (bVar6);
          uVar27 = (ulong)(uint)pVVar10->nSize;
          do {
            iVar9 = (int)uVar17;
            if ((int)uVar27 <= iVar9) {
              __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
            }
            uVar8 = (int)uVar27 - 1;
            uVar27 = (ulong)uVar8;
            pVVar10->nSize = uVar8;
            if (uVar17 < uVar27) {
              piVar11 = pVVar10->pArray;
              uVar20 = uVar17;
              do {
                piVar11[uVar20] = piVar11[uVar20 + 1];
                uVar20 = uVar20 + 1;
                uVar27 = (ulong)pVVar10->nSize;
              } while ((long)uVar20 < (long)uVar27);
            }
            uVar8 = (uint)uVar27;
            uVar17 = uVar17 - 1;
          } while (0 < iVar9);
          uVar22 = pGia->vMapping->nSize;
          if ((long)(int)uVar22 <= (long)uVar24) goto LAB_0078112a;
          piVar11 = pGia->vMapping->pArray;
          uVar3 = piVar11[uVar24];
          if (((long)(int)uVar3 < 0) || (uVar22 <= uVar3)) goto LAB_0078112a;
          if (uVar8 != piVar11[(int)uVar3]) {
            __assert_fail("Vec_IntSize(vLeaves) == Gia_ObjLutSize(pGia, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                          ,0x152,"Mini_Lut_t *Gia_ManToMiniLut(Gia_Man_t *)");
          }
        }
        if ((int)uVar8 < 1) {
          iVar9 = pGia->nObjs;
        }
        else {
          piVar11 = pVVar10->pArray;
          uVar27 = 0;
          do {
            iVar7 = piVar11[uVar27];
            if (((long)iVar7 < 0) || (iVar9 = pGia->nObjs, iVar9 <= iVar7)) goto LAB_00781149;
            if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
            local_78[uVar27] = pGia->pObjs[iVar7].Value;
            uVar27 = uVar27 + 1;
          } while (uVar8 != uVar27);
        }
        if ((long)iVar9 <= (long)uVar24) goto LAB_00781149;
        local_90 = pGia->pObjs + uVar24;
        pwVar14 = Gia_ObjComputeTruthTableCut(pGia,local_90,pVVar10);
        iVar9 = __ptr->nSize;
        if ((long)iVar9 <= (long)uVar24) goto LAB_00781168;
        local_80 = __ptr->pArray;
        if (((uint)local_80[uVar24 >> 5 & 0x7ffffff] >> ((uint)uVar24 & 0x1f) & 1) != 0 &&
            0 < (int)local_d4) {
          uVar27 = 0;
          do {
            pwVar14[uVar27] = ~pwVar14[uVar27];
            uVar27 = uVar27 + 1;
          } while (local_d4 != uVar27);
        }
        iVar7 = pVVar10->nSize;
        if (0 < (long)iVar7) {
          local_88 = pVVar10->pArray;
          uVar27 = 0;
          do {
            uVar8 = local_88[uVar27];
            if (((int)uVar8 < 0) || (iVar9 <= (int)uVar8)) goto LAB_00781168;
            if (((uint)local_80[uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0) {
              if (local_d4 == 1) {
                bVar16 = (byte)(1 << ((byte)uVar27 & 0x1f));
                *pwVar14 = (s_Truths6[uVar27] & *pwVar14) >> (bVar16 & 0x3f) |
                           *pwVar14 << (bVar16 & 0x3f) & s_Truths6[uVar27];
              }
              else if (uVar27 < 6) {
                if (0 < (int)local_d4) {
                  uVar17 = s_Truths6[uVar27];
                  uVar20 = 0;
                  do {
                    bVar16 = (byte)(1 << ((byte)uVar27 & 0x1f));
                    pwVar14[uVar20] =
                         (pwVar14[uVar20] & uVar17) >> (bVar16 & 0x3f) |
                         pwVar14[uVar20] << (bVar16 & 0x3f) & uVar17;
                    uVar20 = uVar20 + 1;
                  } while (local_d4 != uVar20);
                }
              }
              else if (0 < (int)local_d4) {
                bVar16 = (byte)(uVar27 - 6);
                uVar8 = 1 << (bVar16 & 0x1f);
                iVar23 = 2 << (bVar16 & 0x1f);
                uVar17 = 1;
                if (1 < (int)uVar8) {
                  uVar17 = (ulong)uVar8;
                }
                pwVar21 = pwVar14 + (int)uVar8;
                pwVar15 = pwVar14;
                do {
                  if (uVar27 - 6 != 0x1f) {
                    uVar20 = 0;
                    do {
                      wVar5 = pwVar15[uVar20];
                      pwVar15[uVar20] = pwVar21[uVar20];
                      pwVar21[uVar20] = wVar5;
                      uVar20 = uVar20 + 1;
                    } while (uVar17 != uVar20);
                  }
                  pwVar15 = pwVar15 + iVar23;
                  pwVar21 = pwVar21 + iVar23;
                } while (pwVar15 < pwVar14 + local_98);
              }
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != (long)iVar7);
        }
        uVar8 = pGia->vMapping->nSize;
        if ((long)(int)uVar8 <= (long)uVar24) goto LAB_0078112a;
        piVar11 = pGia->vMapping->pArray;
        uVar22 = piVar11[uVar24];
        if (((long)(int)uVar22 < 0) || (uVar8 <= uVar22)) goto LAB_0078112a;
        uVar8 = Mini_LutCreateNode(p,piVar11[(int)uVar22],(int *)local_78,(uint *)pwVar14);
        local_90->Value = uVar8;
        iVar9 = pGia->nObjs;
      }
      uVar24 = uVar24 + 1;
    } while ((long)uVar24 < (long)iVar9);
  }
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
  }
  free(pVVar10);
  lVar25 = local_a0;
  pVVar18 = pGia->vTtMemory;
  pVVar18->nSize = 0;
  if (0 < (int)local_d4) {
    do {
      pVVar18 = pGia->vTtMemory;
      uVar8 = pVVar18->nSize;
      if (uVar8 == pVVar18->nCap) {
        if ((int)uVar8 < 0x10) {
          if (pVVar18->pArray == (word *)0x0) {
            pwVar14 = (word *)malloc(0x80);
          }
          else {
            pwVar14 = (word *)realloc(pVVar18->pArray,0x80);
          }
          pVVar18->pArray = pwVar14;
          if (pwVar14 == (word *)0x0) {
LAB_007811a6:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          pVVar18->nCap = 0x10;
        }
        else {
          if (pVVar18->pArray == (word *)0x0) {
            pwVar14 = (word *)malloc((ulong)uVar8 << 4);
          }
          else {
            pwVar14 = (word *)realloc(pVVar18->pArray,(ulong)uVar8 << 4);
          }
          pVVar18->pArray = pwVar14;
          if (pwVar14 == (word *)0x0) goto LAB_007811a6;
          pVVar18->nCap = uVar8 * 2;
        }
      }
      else {
        pwVar14 = pVVar18->pArray;
      }
      iVar9 = pVVar18->nSize;
      pVVar18->nSize = iVar9 + 1;
      pwVar14[iVar9] = 0x5555555555555555;
      local_d4 = local_d4 - 1;
    } while (local_d4 != 0);
    pVVar18 = pGia->vTtMemory;
  }
  pVVar10 = pGia->vCos;
  if (0 < pVVar10->nSize) {
    pwVar14 = pVVar18->pArray;
    lVar26 = 0;
    do {
      iVar9 = pVVar10->pArray[lVar26];
      if (((long)iVar9 < 0) || (pGia->nObjs <= iVar9)) {
LAB_00781149:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4 = pGia->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar4 + iVar9;
      uVar22 = (uint)*(undefined8 *)pGVar1 & 0x1fffffff;
      pGVar2 = pGVar1 + -(ulong)uVar22;
      uVar8 = (uint)*(undefined8 *)pGVar1 >> 0x1d;
      if (pGVar2 == pGVar4) {
        uVar8 = uVar8 & 1;
LAB_0078105a:
        uVar8 = Mini_LutCreatePo(p,uVar8);
        pGVar1->Value = uVar8;
      }
      else {
        uVar22 = iVar9 - uVar22;
        if (((int)uVar22 < 0) || (__ptr->nSize <= (int)uVar22)) {
LAB_00781168:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((((uint)__ptr->pArray[uVar22 >> 5] >> ((byte)uVar22 & 0x1f) ^ uVar8) & 1) == 0) {
          uVar8 = pGVar2->Value;
          goto LAB_0078105a;
        }
        local_a4 = pGVar2->Value;
        lVar19 = (long)(int)local_a4;
        if ((lVar19 < 0) || ((int)lVar25 <= (int)local_a4)) {
LAB_0078112a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar9 = *(int *)((long)__s + lVar19 * 4);
        if (iVar9 == 0) {
          iVar9 = Mini_LutCreateNode(p,1,(int *)&local_a4,(uint *)pwVar14);
          *(int *)((long)__s + lVar19 * 4) = iVar9;
        }
        uVar8 = Mini_LutCreatePo(p,iVar9);
        pGVar1->Value = uVar8;
      }
      lVar26 = lVar26 + 1;
      pVVar10 = pGia->vCos;
    } while (lVar26 < pVVar10->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  Gia_ObjComputeTruthTableStop(pGia);
  p->nRegs = pGia->nRegs;
  return p;
}

Assistant:

Mini_Lut_t * Gia_ManToMiniLut( Gia_Man_t * pGia )
{
    Mini_Lut_t * p;
    Vec_Bit_t * vMarks;
    Gia_Obj_t * pObj, * pFanin;
    Vec_Int_t * vLeaves = Vec_IntAlloc( 16 );
    Vec_Int_t * vInvMap = Vec_IntStart( Gia_ManObjNum(pGia) );
    int i, k, iFanin, LutSize, nWords, Count = 0, pVars[16];
    word * pTruth;
    assert( Gia_ManHasMapping(pGia) );
    LutSize = Gia_ManLutSizeMax( pGia );
    LutSize = Abc_MaxInt( LutSize, 2 );
    nWords  = Abc_Truth6WordNum( LutSize );
    assert( LutSize >= 2 );
    // create the manager
    p = Mini_LutStart( LutSize );
    // create primary inputs
    Gia_ManFillValue( pGia );
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachCi( pGia, pObj, i )
        pObj->Value = Mini_LutCreatePi(p);
    // create internal nodes
    vMarks = Gia_ManFindComplLuts( pGia );
    Gia_ObjComputeTruthTableStart( pGia, LutSize );
    Gia_ManForEachLut( pGia, i )
    {
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( pGia, i, iFanin, k )
            Vec_IntPush( vLeaves, iFanin );
        if ( Vec_IntSize(vLeaves) > 6 )
        {
            int Extra = Vec_IntSize(vLeaves) - 7;
            for ( k = Extra; k >= 0; k-- )
                Vec_IntPush( vLeaves, Vec_IntEntry(vLeaves, k) );
            for ( k = Extra; k >= 0; k-- )
                Vec_IntDrop( vLeaves, k );
            assert( Vec_IntSize(vLeaves) == Gia_ObjLutSize(pGia, i) );
        }
        Gia_ManForEachObjVec( vLeaves, pGia, pFanin, k )
            pVars[k] = pFanin->Value;
        pObj = Gia_ManObj( pGia, i );
        pTruth = Gia_ObjComputeTruthTableCut( pGia, pObj, vLeaves );
        if ( Vec_BitEntry(vMarks, i) )
            Abc_TtNot( pTruth, nWords );
        Vec_IntForEachEntry( vLeaves, iFanin, k )
            if ( Vec_BitEntry(vMarks, iFanin) )
                Abc_TtFlip( pTruth, nWords, k );
        pObj->Value = Mini_LutCreateNode( p, Gia_ObjLutSize(pGia, i), pVars, (unsigned *)pTruth );
    }
    Vec_IntFree( vLeaves );
    // create inverter truth table
    Vec_WrdClear( pGia->vTtMemory );
    for ( i = 0; i < nWords; i++ )
        Vec_WrdPush( pGia->vTtMemory, ABC_CONST(0x5555555555555555) );
    pTruth = Vec_WrdArray( pGia->vTtMemory );
    // create primary outputs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        if ( Gia_ObjFanin0(pObj) == Gia_ManConst0(pGia) )
            pObj->Value = Mini_LutCreatePo( p, Gia_ObjFaninC0(pObj) );
        else if ( Gia_ObjFaninC0(pObj) == Vec_BitEntry(vMarks, Gia_ObjFaninId0p(pGia, pObj)) )
            pObj->Value = Mini_LutCreatePo( p, Gia_ObjFanin0(pObj)->Value );
        else // add inverter LUT
        {
            int LutInv, Fanin = Gia_ObjFanin0(pObj)->Value;
            if ( (LutInv = Vec_IntEntry(vInvMap, Fanin)) == 0 )
            {
                LutInv = Mini_LutCreateNode( p, 1, &Fanin, (unsigned *)pTruth );
                Vec_IntWriteEntry( vInvMap, Fanin, LutInv );
                Count++;
            }
            pObj->Value = Mini_LutCreatePo( p, LutInv );
        }
    }
    Vec_IntFree( vInvMap );
    Vec_BitFree( vMarks );
    Gia_ObjComputeTruthTableStop( pGia );
    // set registers
    Mini_LutSetRegNum( p, Gia_ManRegNum(pGia) );
    //Mini_LutPrintStats( p );
    //printf( "Added %d inverters.\n", Count );
    return p;
}